

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivySeq.c
# Opt level: O2

int Ivy_ManRewriteSeq(Ivy_Man_t *p,int fUseZeroCost,int fVerbose)

{
  Dec_Node_t *pDVar1;
  char cVar2;
  Vec_Ptr_t *p_00;
  Dec_Node_t *pDVar3;
  short sVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  abctime aVar8;
  void *pvVar9;
  Rwt_Man_t *p_01;
  Ivy_Obj_t *pObj;
  abctime aVar10;
  abctime aVar11;
  Ivy_Obj_t *pIVar13;
  abctime aVar14;
  ulong uVar15;
  int *piVar16;
  Dec_Graph_t *pDVar17;
  ulong uVar18;
  int *piVar19;
  long lVar20;
  int iVar21;
  int i;
  int iVar22;
  Ivy_Obj_t *p0;
  Vec_Ptr_t *pVVar23;
  char *pcVar24;
  int iVar25;
  int iVar26;
  long lVar27;
  uint uVar28;
  anon_union_8_2_00c7e208_for_Dec_Node_t__2 aVar29;
  anon_union_8_2_00c7e208_for_Dec_Node_t__2 aVar30;
  int local_e4;
  int local_cc;
  uint local_c0;
  Dec_Graph_t *local_a0;
  long local_78;
  long lVar12;
  
  aVar8 = Abc_Clock();
  for (iVar21 = 0; iVar21 < p->vObjs->nSize; iVar21 = iVar21 + 1) {
    pvVar9 = Vec_PtrEntry(p->vObjs,iVar21);
    if ((pvVar9 != (void *)0x0) && ((*(uint *)((long)pvVar9 + 8) & 0xf) == 4)) {
      *(uint *)((long)pvVar9 + 8) = *(uint *)((long)pvVar9 + 8) | 0x600;
    }
  }
  iVar21 = 0;
  p_01 = Rwt_ManStart(0);
  p->pData = p_01;
  if (p_01 != (Rwt_Man_t *)0x0) {
    if (p->fFanout == 0) {
      Ivy_ManStartFanout(p);
    }
    pVVar23 = p->vObjs;
    iVar21 = pVVar23->nSize;
    iVar7 = iVar21;
    for (i = 0; i < iVar7; i = i + 1) {
      pObj = (Ivy_Obj_t *)Vec_PtrEntry(pVVar23,i);
      if ((pObj != (Ivy_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pObj->field_0x8 & 0xf) - 7)) {
        if ((*(uint *)(((ulong)pObj->pFanin0 & 0xfffffffffffffffe) + 8) & 0xf) == 7) {
          pcVar24 = "!Ivy_ObjIsBuf(Ivy_ObjFanin0(pNode))";
          uVar5 = 0x56;
LAB_005f8d79:
          __assert_fail(pcVar24,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivySeq.c"
                        ,uVar5,"int Ivy_ManRewriteSeq(Ivy_Man_t *, int, int)");
        }
        if ((*(uint *)(((ulong)pObj->pFanin1 & 0xfffffffffffffffe) + 8) & 0xf) == 7) {
          pcVar24 = "!Ivy_ObjIsBuf(Ivy_ObjFanin1(pNode))";
          uVar5 = 0x57;
          goto LAB_005f8d79;
        }
        if (iVar21 <= i) break;
        p_01->nNodesConsidered = p_01->nNodesConsidered + 1;
        aVar10 = Abc_Clock();
        Ivy_CutComputeForNode(p,pObj,5);
        aVar11 = Abc_Clock();
        p_01->timeCut = p_01->timeCut + (aVar11 - aVar10);
        local_c0 = 0;
        aVar10 = Abc_Clock();
        local_78 = 0xb558cc;
        local_e4 = -1;
        iVar7 = -1;
        for (lVar20 = 1; lVar20 < Ivy_CutComputeForNode::CutStore.nCuts; lVar20 = lVar20 + 1) {
          if (Ivy_CutComputeForNode::CutStore.pCuts[lVar20].nSize == 4) {
            piVar16 = Ivy_CutComputeForNode::CutStore.pCuts[lVar20].pArray;
            sVar4 = 4;
            for (lVar27 = 0; lVar12 = (long)sVar4, lVar27 < lVar12; lVar27 = lVar27 + 1) {
              pIVar13 = Ivy_ManObj(p,*(int *)(local_78 + lVar27 * 4) >> 8);
              sVar4 = Ivy_CutComputeForNode::CutStore.pCuts[lVar20].nSize;
              if ((*(uint *)&pIVar13->field_0x8 & 0xf) == 7) {
                lVar12 = (long)sVar4;
                break;
              }
            }
            if (lVar12 == lVar27) {
              p_01->nCutsGood = p_01->nCutsGood + 1;
              aVar11 = Abc_Clock();
              if ((*(uint *)&pObj->field_0x8 & 0xf) - 7 < 0xfffffffe) {
                __assert_fail("Ivy_ObjIsNode(pObj)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivySeq.c"
                              ,0x25c,
                              "unsigned int Ivy_CutGetTruth(Ivy_Man_t *, Ivy_Obj_t *, int *, int)");
              }
              sVar4 = Ivy_CutComputeForNode::CutStore.pCuts[lVar20].nSize;
              if (5 < sVar4) {
                __assert_fail("nNums < 6",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivySeq.c"
                              ,0x25d,
                              "unsigned int Ivy_CutGetTruth(Ivy_Man_t *, Ivy_Obj_t *, int *, int)");
              }
              uVar5 = Ivy_CutGetTruth_rec(p,pObj->Id << 8,piVar16,(int)sVar4);
              uVar5 = uVar5 & 0xffff;
              aVar14 = Abc_Clock();
              p_01->timeTruth = p_01->timeTruth + (aVar14 - aVar11);
              pcVar24 = p_01->pPerms4[p_01->pPerms[uVar5]];
              cVar2 = p_01->pPhases[uVar5];
              pVVar23 = p_01->vFaninsCur;
              pVVar23->nSize = 0;
              sVar4 = Ivy_CutComputeForNode::CutStore.pCuts[lVar20].nSize;
              uVar28 = (uint)sVar4;
              Vec_PtrGrow(pVVar23,uVar28);
              uVar15 = 0;
              if (0 < sVar4) {
                uVar15 = (ulong)uVar28;
              }
              for (uVar18 = 0; uVar15 != uVar18; uVar18 = uVar18 + 1) {
                pVVar23->pArray[uVar18] = (void *)0x0;
              }
              pVVar23->nSize = uVar28;
              for (lVar27 = 0; lVar27 < Ivy_CutComputeForNode::CutStore.pCuts[lVar20].nSize;
                  lVar27 = lVar27 + 1) {
                pIVar13 = Ivy_ManObj(p,piVar16[pcVar24[lVar27]] >> 8);
                uVar28 = *(uint *)&pIVar13->field_0x8 & 0xf;
                if ((((uVar28 - 7 < 0xfffffffe) && (uVar28 != 1)) && (uVar28 != 4)) &&
                   (pIVar13->Id != 0)) {
                  __assert_fail("Ivy_ObjIsNode(pFanin) || Ivy_ObjIsCi(pFanin) || Ivy_ObjIsConst1(pFanin)"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivySeq.c"
                                ,199,
                                "int Ivy_NodeRewriteSeq(Ivy_Man_t *, Rwt_Man_t *, Ivy_Obj_t *, int)"
                               );
                }
                if (p_01->vFaninsCur->nSize <= lVar27) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                                ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
                }
                p_01->vFaninsCur->pArray[lVar27] =
                     (void *)((ulong)pIVar13 ^
                             (ulong)(((uint)(int)cVar2 >> ((uint)lVar27 & 0x1f) & 1) != 0));
              }
              aVar11 = Abc_Clock();
              for (iVar25 = 0; iVar25 < p_01->vFaninsCur->nSize; iVar25 = iVar25 + 1) {
                pvVar9 = Vec_PtrEntry(p_01->vFaninsCur,iVar25);
                piVar16 = (int *)(((ulong)pvVar9 & 0xfffffffffffffffe) + 0xc);
                *piVar16 = *piVar16 + 1;
              }
              Ivy_ManIncrementTravId(p);
              iVar25 = Ivy_ObjMffcLabel(p,pObj);
              for (iVar26 = 0; iVar26 < p_01->vFaninsCur->nSize; iVar26 = iVar26 + 1) {
                pvVar9 = Vec_PtrEntry(p_01->vFaninsCur,iVar26);
                iVar22 = *(int *)(((ulong)pvVar9 & 0xfffffffffffffffe) + 0xc);
                if (iVar22 < 1) {
                  __assert_fail("pObj->nRefs > 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivy.h"
                                ,0x10a,"void Ivy_ObjRefsDec(Ivy_Obj_t *)");
                }
                *(int *)(((ulong)pvVar9 & 0xfffffffffffffffe) + 0xc) = iVar22 + -1;
              }
              aVar14 = Abc_Clock();
              p_01->timeMffc = p_01->timeMffc + (aVar14 - aVar11);
              aVar11 = Abc_Clock();
              if (p_01->vClasses->nSize <= (int)(uint)p_01->pMap[uVar5]) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecVec.h"
                              ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
              }
              pVVar23 = p_01->vFaninsCur;
              p_00 = (Vec_Ptr_t *)p_01->vClasses->pArray[p_01->pMap[uVar5]];
              iVar26 = p_00->nSize;
              p_01->nSubgraphs = p_01->nSubgraphs + iVar26;
              local_a0 = (Dec_Graph_t *)0x0;
              local_cc = -1;
              for (iVar22 = 0; iVar22 < iVar26; iVar22 = iVar22 + 1) {
                pvVar9 = Vec_PtrEntry(p_00,iVar22);
                pDVar17 = *(Dec_Graph_t **)((long)pvVar9 + 0x20);
                Ivy_GraphPrepare(pDVar17,Ivy_CutComputeForNode::CutStore.pCuts + lVar20,pVVar23,
                                 pcVar24);
                iVar26 = 0;
                if ((pDVar17->fConst == 0) &&
                   (uVar15 = (ulong)(uint)pDVar17->nLeaves,
                   (uint)pDVar17->nLeaves <= ((uint)pDVar17->eRoot >> 1 & 0x3fffffff))) {
                  iVar26 = 0;
                  for (; (long)uVar15 < (long)pDVar17->nSize; uVar15 = uVar15 + 1) {
                    pDVar3 = pDVar17->pNodes;
                    pDVar1 = pDVar3 + uVar15;
                    aVar29 = pDVar3[(uint)pDVar3[uVar15].eEdge0 >> 1 & 0x3fffffff].field_2;
                    aVar30 = pDVar3[(uint)pDVar3[uVar15].eEdge1 >> 1 & 0x3fffffff].field_2;
                    uVar28 = 0;
                    while ((aVar29.pFunc != (void *)0x0 &&
                           (uVar28 < (*(uint *)&pDVar1->field_0x10 >> 0x11 & 0x1f)))) {
                      pIVar13 = Ivy_ObjCreateGhost(p,(Ivy_Obj_t *)
                                                     ((ulong)aVar29.pFunc & 0xfffffffffffffffe),
                                                   (Ivy_Obj_t *)0x0,IVY_LATCH,IVY_INIT_DC);
                      pIVar13 = Ivy_TableLookup(p,pIVar13);
                      aVar29.pFunc = (void *)((ulong)(aVar29.iFunc & 1) ^ (ulong)pIVar13);
                      uVar28 = uVar28 + 1;
                      if (pIVar13 == (Ivy_Obj_t *)0x0) {
                        aVar29.pFunc = (void *)0x0;
                      }
                    }
                    uVar28 = 0;
                    while (aVar30.pFunc != (void *)0x0) {
                      if ((*(uint *)&pDVar1->field_0x10 >> 0x16 & 0x1f) <= uVar28) {
                        if (aVar29.pFunc != (void *)0x0) {
                          piVar16 = (int *)((ulong)aVar29.pFunc & 0xfffffffffffffffe);
                          piVar19 = (int *)((ulong)aVar30.pFunc & 0xfffffffffffffffe);
                          if (((piVar16[2] & 0xfU) == 4) && ((piVar19[2] & 0xfU) == 4)) {
                            __assert_fail("!Ivy_ObjIsLatch(Ivy_Regular(pAnd0)) || !Ivy_ObjIsLatch(Ivy_Regular(pAnd1))"
                                          ,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivySeq.c"
                                          ,0x1ba,
                                          "int Ivy_GraphToNetworkSeqCountSeq(Ivy_Man_t *, Ivy_Obj_t *, Dec_Graph_t *, int)"
                                         );
                          }
                          p0 = (Ivy_Obj_t *)
                               ((ulong)((uint)pDVar1->eEdge0 & 1) ^ (ulong)aVar29.pFunc);
                          pIVar13 = (Ivy_Obj_t *)
                                    ((ulong)((uint)pDVar1->eEdge1 & 1) ^ (ulong)aVar30.pFunc);
                          if (((piVar16 == piVar19) || (*piVar16 == 0)) || (*piVar19 == 0)) {
                            pIVar13 = Ivy_And(p,p0,pIVar13);
                          }
                          else {
                            pIVar13 = Ivy_ObjCreateGhost(p,p0,pIVar13,IVY_AND,IVY_INIT_NONE);
                            pIVar13 = Ivy_TableLookup(p,pIVar13);
                          }
                          if (pObj == (Ivy_Obj_t *)((ulong)pIVar13 & 0xfffffffffffffffe))
                          goto LAB_005f89c8;
                          if (pIVar13 == (Ivy_Obj_t *)0x0) {
                            pIVar13 = (Ivy_Obj_t *)0x0;
                          }
                          else if (((Ivy_Obj_t *)((ulong)pIVar13 & 0xfffffffffffffffe))->TravId !=
                                   p->nTravIds) goto LAB_005f8977;
                          goto LAB_005f896b;
                        }
                        break;
                      }
                      pIVar13 = Ivy_ObjCreateGhost(p,(Ivy_Obj_t *)
                                                     ((ulong)aVar30.pFunc & 0xfffffffffffffffe),
                                                   (Ivy_Obj_t *)0x0,IVY_LATCH,IVY_INIT_DC);
                      pIVar13 = Ivy_TableLookup(p,pIVar13);
                      aVar30.pFunc = (void *)((ulong)(aVar30.iFunc & 1) ^ (ulong)pIVar13);
                      uVar28 = uVar28 + 1;
                      if (pIVar13 == (Ivy_Obj_t *)0x0) {
                        aVar30.pFunc = (void *)0x0;
                      }
                    }
                    pIVar13 = (Ivy_Obj_t *)0x0;
LAB_005f896b:
                    if (iVar25 <= iVar26) goto LAB_005f89c8;
                    iVar26 = iVar26 + 1;
LAB_005f8977:
                    (pDVar1->field_2).pFunc = pIVar13;
                  }
                  if (iVar26 != -1) goto LAB_005f899f;
                }
                else {
LAB_005f899f:
                  iVar6 = iVar25 - iVar26;
                  if (iVar25 < iVar26) {
                    __assert_fail("nNodesSaved >= nNodesAdded",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivySeq.c"
                                  ,0x153,
                                  "Dec_Graph_t *Rwt_CutEvaluateSeq(Ivy_Man_t *, Rwt_Man_t *, Ivy_Obj_t *, Ivy_Cut_t *, char *, Vec_Ptr_t *, int, int *, unsigned int)"
                                 );
                  }
                  if (local_cc < iVar6) {
                    local_a0 = pDVar17;
                  }
                  if (local_cc <= iVar6) {
                    local_cc = iVar6;
                  }
                }
LAB_005f89c8:
                iVar26 = p_00->nSize;
              }
              if (local_cc == -1) {
                local_a0 = (Dec_Graph_t *)0x0;
                local_cc = iVar7;
              }
              iVar7 = local_cc;
              aVar14 = Abc_Clock();
              p_01->timeEval = p_01->timeEval + (aVar14 - aVar11);
              if ((local_a0 != (Dec_Graph_t *)0x0) && (local_e4 < iVar7)) {
                p_01->pGraph = local_a0;
                p_01->pCut = Ivy_CutComputeForNode::CutStore.pCuts + lVar20;
                p_01->pPerm = pcVar24;
                p_01->fCompl = (uint)(int)cVar2 >> 4 & 1;
                p_01->vFanins->nSize = 0;
                for (iVar25 = 0; local_e4 = iVar7, local_c0 = uVar5,
                    iVar25 < p_01->vFaninsCur->nSize; iVar25 = iVar25 + 1) {
                  pvVar9 = Vec_PtrEntry(p_01->vFaninsCur,iVar25);
                  pVVar23 = p_01->vFanins;
                  iVar26 = pVVar23->nSize;
                  if (iVar26 == pVVar23->nCap) {
                    iVar22 = iVar26 * 2;
                    if (iVar26 < 0x10) {
                      iVar22 = 0x10;
                    }
                    Vec_PtrGrow(pVVar23,iVar22);
                    iVar26 = pVVar23->nSize;
                  }
                  pVVar23->nSize = iVar26 + 1;
                  pVVar23->pArray[iVar26] = pvVar9;
                }
              }
            }
            else {
              p_01->nCutsBad = p_01->nCutsBad + 1;
            }
          }
          local_78 = local_78 + 0x24;
        }
        aVar11 = Abc_Clock();
        p_01->timeRes = p_01->timeRes + (aVar11 - aVar10);
        if (local_e4 != -1) {
          Ivy_GraphPrepare((Dec_Graph_t *)p_01->pGraph,(Ivy_Cut_t *)p_01->pCut,p_01->vFanins,
                           p_01->pPerm);
          p_01->nScores[p_01->pMap[local_c0]] = p_01->nScores[p_01->pMap[local_c0]] + 1;
          p_01->nNodesGained = p_01->nNodesGained + local_e4;
          if ((fUseZeroCost != 0) || (0 < local_e4)) {
            p_01->nNodesRewritten = p_01->nNodesRewritten + 1;
            if ((0 < local_e4) || (fUseZeroCost != 0 && local_e4 == 0)) {
              pDVar17 = (Dec_Graph_t *)Rwt_ManReadDecs(p_01);
              iVar7 = Rwt_ManReadCompl(p_01);
              aVar10 = Abc_Clock();
              if (iVar7 == 0) {
                Ivy_GraphUpdateNetworkSeq(p,pObj,pDVar17,local_e4);
              }
              else {
                *(byte *)&pDVar17->eRoot = *(byte *)&pDVar17->eRoot ^ 1;
                Ivy_GraphUpdateNetworkSeq(p,pObj,pDVar17,local_e4);
                *(byte *)&pDVar17->eRoot = *(byte *)&pDVar17->eRoot ^ 1;
              }
              aVar11 = Abc_Clock();
              Rwt_ManAddTimeUpdate(p_01,aVar11 - aVar10);
            }
          }
        }
      }
      pVVar23 = p->vObjs;
      iVar7 = pVVar23->nSize;
    }
    aVar10 = Abc_Clock();
    Rwt_ManAddTimeTotal(p_01,aVar10 - aVar8);
    if (fVerbose != 0) {
      Rwt_ManPrintStats(p_01);
    }
    Rwt_ManStop(p_01);
    p->pData = (void *)0x0;
    Ivy_ManResetLevels(p);
    iVar7 = Ivy_ManCheck(p);
    iVar21 = 1;
    if (iVar7 == 0) {
      puts("Ivy_ManRewritePre(): The check has failed.");
    }
  }
  return iVar21;
}

Assistant:

int Ivy_ManRewriteSeq( Ivy_Man_t * p, int fUseZeroCost, int fVerbose )
{ 
    Rwt_Man_t * pManRwt;
    Ivy_Obj_t * pNode;
    int i, nNodes, nGain;
    abctime clk, clkStart = Abc_Clock();

    // set the DC latch values
    Ivy_ManForEachLatch( p, pNode, i )
        pNode->Init = IVY_INIT_DC;
    // start the rewriting manager
    pManRwt = Rwt_ManStart( 0 );
    p->pData = pManRwt;
    if ( pManRwt == NULL )
        return 0; 
    // create fanouts
    if ( p->fFanout == 0 )
        Ivy_ManStartFanout( p );
    // resynthesize each node once
    nNodes = Ivy_ManObjIdMax(p);
    Ivy_ManForEachNode( p, pNode, i )
    {
        assert( !Ivy_ObjIsBuf(pNode) );
        assert( !Ivy_ObjIsBuf(Ivy_ObjFanin0(pNode)) );
        assert( !Ivy_ObjIsBuf(Ivy_ObjFanin1(pNode)) );
        // fix the fanin buffer problem
//        Ivy_NodeFixBufferFanins( p, pNode );
//        if ( Ivy_ObjIsBuf(pNode) )
//            continue;
        // stop if all nodes have been tried once
        if ( i > nNodes ) 
            break;
        // for each cut, try to resynthesize it
        nGain = Ivy_NodeRewriteSeq( p, pManRwt, pNode, fUseZeroCost );
        if ( nGain > 0 || (nGain == 0 && fUseZeroCost) )
        {
            Dec_Graph_t * pGraph = (Dec_Graph_t *)Rwt_ManReadDecs(pManRwt);
            int fCompl           = Rwt_ManReadCompl(pManRwt);
            // complement the FF if needed
clk = Abc_Clock();
            if ( fCompl ) Dec_GraphComplement( pGraph );
            Ivy_GraphUpdateNetworkSeq( p, pNode, pGraph, nGain );
            if ( fCompl ) Dec_GraphComplement( pGraph );
Rwt_ManAddTimeUpdate( pManRwt, Abc_Clock() - clk );
        }
    }
Rwt_ManAddTimeTotal( pManRwt, Abc_Clock() - clkStart );
    // print stats
    if ( fVerbose )
        Rwt_ManPrintStats( pManRwt );
    // delete the managers
    Rwt_ManStop( pManRwt );
    p->pData = NULL;
    // fix the levels
    Ivy_ManResetLevels( p );
//    if ( Ivy_ManCheckFanoutNums(p) )
//        printf( "Ivy_ManRewritePre(): The check has failed.\n" );
    // check
    if ( !Ivy_ManCheck(p) )
        printf( "Ivy_ManRewritePre(): The check has failed.\n" );
    return 1;
}